

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

size_t gl3cts::TextureSwizzle::get_index_of_format(GLenum internal_format)

{
  TestError *this;
  ulong local_20;
  size_t i;
  size_t sStack_10;
  GLenum internal_format_local;
  
  if (internal_format == 0) {
    sStack_10 = 0;
  }
  else {
    local_20 = 0;
    while( true ) {
      if (0x46 < local_20) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unknown internal format",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                   ,0x721);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (*(GLenum *)(texture_formats + local_20 * 0x78 + 4) == internal_format) break;
      local_20 = local_20 + 1;
    }
    sStack_10 = local_20;
  }
  return sStack_10;
}

Assistant:

size_t get_index_of_format(glw::GLenum internal_format)
{
	if (GL_ZERO == internal_format)
	{
		return 0;
	}

	for (size_t i = 0; i < n_texture_formats; ++i)
	{
		if (texture_formats[i].m_internal_format == internal_format)
		{
			return i;
		}
	}

	TCU_FAIL("Unknown internal format");
	return -1;
}